

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.cpp
# Opt level: O0

char * __thiscall soul::UTF8Reader::findInvalidData(UTF8Reader *this)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  UnicodeChar UVar4;
  UTF8Reader local_40;
  int local_38;
  uint local_34;
  int numExtraValues;
  int bit;
  char *errorPos;
  char *pcStack_20;
  char byte;
  char *t;
  UTF8Reader *this_local;
  
  pcVar3 = this->data;
  t = (char *)this;
  do {
    do {
      pcStack_20 = pcVar3;
      if (*pcStack_20 == '\0') {
        return (char *)0x0;
      }
      errorPos._7_1_ = *pcStack_20;
      pcVar3 = pcStack_20 + 1;
    } while (-1 < errorPos._7_1_);
    _numExtraValues = pcStack_20;
    local_34 = 0x40;
    local_38 = 0;
    pcStack_20 = pcStack_20 + 1;
    while (((int)errorPos._7_1_ & local_34) != 0) {
      if ((int)local_34 < 8) {
        return _numExtraValues;
      }
      local_38 = local_38 + 1;
      local_34 = (int)local_34 >> 1;
      bVar2 = false;
      if (local_34 == 8) {
        UTF8Reader(&local_40,pcStack_20);
        UVar4 = operator*(&local_40);
        bVar2 = 0x10ffff < UVar4;
      }
      if (bVar2) {
        return _numExtraValues;
      }
    }
    if (local_38 == 0) {
      return _numExtraValues;
    }
    while (local_38 = local_38 + -1, pcVar3 = pcStack_20, -1 < local_38) {
      cVar1 = *pcStack_20;
      pcStack_20 = pcStack_20 + 1;
      if (((int)cVar1 & 0xc0U) != 0x80) {
        return _numExtraValues;
      }
    }
  } while( true );
}

Assistant:

const char* UTF8Reader::findInvalidData() const
{
    for (auto t = data; *t != 0;)
    {
        auto byte = (signed char) *t++;

        if (byte < 0)
        {
            auto errorPos = t - 1;
            int bit = 0x40;
            int numExtraValues = 0;

            while ((byte & bit) != 0)
            {
                if (bit < 8)
                    return errorPos;

                ++numExtraValues;
                bit >>= 1;

                if (bit == 8 && *UTF8Reader (t) > 0x10ffff)
                    return errorPos;
            }

            if (numExtraValues == 0)
                return errorPos;

            while (--numExtraValues >= 0)
                if ((*t++ & 0xc0) != 0x80)
                    return errorPos;
        }
    }

    return nullptr;
}